

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaPat.c
# Opt level: O0

void Gia_SatCollectCone_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vVisit)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vVisit_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Sat_ObjXValue(pObj);
  if (iVar1 != 3) {
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 != 0) {
      pGVar2 = Gia_ObjFanin0(pObj);
      Gia_SatCollectCone_rec(p,pGVar2,vVisit);
      pGVar2 = Gia_ObjFanin1(pObj);
      Gia_SatCollectCone_rec(p,pGVar2,vVisit);
    }
    iVar1 = Sat_ObjXValue(pObj);
    if (iVar1 != 0) {
      __assert_fail("Sat_ObjXValue(pObj) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaPat.c"
                    ,0x39,"void Gia_SatCollectCone_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    Sat_ObjSetXValue(pObj,3);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vVisit,iVar1);
  }
  return;
}

Assistant:

void Gia_SatCollectCone_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vVisit )
{
    if ( Sat_ObjXValue(pObj) == GIA_UND )
        return;
    if ( Gia_ObjIsAnd(pObj) )
    {
        Gia_SatCollectCone_rec( p, Gia_ObjFanin0(pObj), vVisit );
        Gia_SatCollectCone_rec( p, Gia_ObjFanin1(pObj), vVisit );
    }
    assert( Sat_ObjXValue(pObj) == 0 );
    Sat_ObjSetXValue( pObj, GIA_UND );
    Vec_IntPush( vVisit, Gia_ObjId(p, pObj) );
}